

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O3

void av1_convolve_2d_scale_sse4_1
               (uint8_t *src,int src_stride,uint8_t *dst8,int dst8_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params)

{
  ushort uVar1;
  int iVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  uint8_t uVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  CONV_BUF_TYPE *pCVar23;
  long lVar24;
  uint8_t *puVar25;
  uint uVar26;
  undefined1 (*pauVar27) [16];
  undefined2 *puVar28;
  uint uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  short sVar32;
  short sVar34;
  undefined1 in_XMM4 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar38;
  short sVar40;
  short sVar41;
  short sVar42;
  undefined1 in_XMM7 [16];
  undefined1 auVar39 [16];
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 in_XMM8 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  ulong uStack_10cb0;
  uint uStack_10c90;
  undefined2 auStack_10c38 [34308];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  uVar14 = ((h + -1) * y_step_qn + subpel_y_qn >> 10) + (uint)filter_params_y->taps;
  iVar2 = conv_params->round_0;
  bVar9 = (byte)iVar2;
  iVar17 = 1 << (bVar9 & 0x1f);
  lVar16 = (long)(int)uVar14;
  if (0 < w) {
    lVar6 = -(long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    iVar20 = iVar17 / 2 + 0x4000;
    auVar30 = ZEXT416((uint)conv_params->round_0);
    lVar19 = (long)src_stride;
    piVar3 = filter_params_x->filter_ptr;
    uVar1 = filter_params_x->taps;
    puVar28 = auStack_10c38;
    uVar8 = 0;
    do {
      uVar15 = (uint)subpel_x_qn >> 6 & 0xf;
      uVar7 = 0;
      if (3 < (int)uVar14) {
        uStack_10c90 = (uint)uVar1;
        auVar31 = *(undefined1 (*) [16])(piVar3 + uVar15 * uStack_10c90);
        puVar25 = src + (subpel_x_qn >> 10) + lVar6;
        uVar7 = 0;
        do {
          auVar33 = pmovzxbw(in_XMM4,*(undefined8 *)(puVar25 + -3));
          auVar35 = pmovzxbw(in_XMM5,*(undefined8 *)(puVar25 + lVar19 + -3));
          auVar36 = pmovzxbw(in_XMM6,*(undefined8 *)(puVar25 + (long)(src_stride * 2) + -3));
          auVar39 = pmovzxbw(in_XMM7,*(undefined8 *)(puVar25 + (long)(src_stride * 3) + -3));
          auVar33 = pmaddwd(auVar33,auVar31);
          in_XMM5 = pmaddwd(auVar35,auVar31);
          auVar33 = phaddd(auVar33,in_XMM5);
          auVar35 = pmaddwd(auVar36,auVar31);
          in_XMM7 = pmaddwd(auVar39,auVar31);
          in_XMM6 = phaddd(auVar35,in_XMM7);
          auVar33 = phaddd(auVar33,in_XMM6);
          auVar35._0_4_ = auVar33._0_4_ + iVar20 >> auVar30;
          auVar35._4_4_ = auVar33._4_4_ + iVar20 >> auVar30;
          auVar35._8_4_ = auVar33._8_4_ + iVar20 >> auVar30;
          auVar35._12_4_ = auVar33._12_4_ + iVar20 >> auVar30;
          in_XMM4 = packusdw(auVar35,auVar35);
          *(long *)(puVar28 + uVar7) = in_XMM4._0_8_;
          uVar7 = uVar7 + 4;
          puVar25 = puVar25 + lVar19 * 4;
        } while ((long)uVar7 <= (long)(int)(uVar14 - 4));
      }
      if ((int)uVar7 < (int)uVar14) {
        uVar7 = uVar7 & 0xffffffff;
        puVar25 = src + lVar19 * uVar7 + (long)(subpel_x_qn >> 10) + lVar6 + -3;
        do {
          lVar24 = 0;
          auVar31 = ZEXT416(0x4000);
          do {
            in_XMM4 = pmovzxwd(in_XMM4,*(undefined8 *)
                                        ((long)piVar3 +
                                        lVar24 * 2 + (ulong)uVar15 * (ulong)((uint)uVar1 * 2)));
            auVar33 = pmovzxbd(in_XMM5,*(undefined4 *)(puVar25 + lVar24));
            in_XMM5 = pmaddwd(auVar33,in_XMM4);
            auVar33._0_4_ = auVar31._0_4_ + in_XMM5._0_4_;
            auVar33._4_4_ = auVar31._4_4_ + in_XMM5._4_4_;
            auVar33._8_4_ = auVar31._8_4_ + in_XMM5._8_4_;
            auVar33._12_4_ = auVar31._12_4_ + in_XMM5._12_4_;
            lVar24 = lVar24 + 4;
            auVar31 = auVar33;
          } while (lVar24 != 8);
          auVar31 = phaddd(auVar33,auVar33);
          auVar31 = phaddd(auVar31,auVar31);
          auStack_10c38[uVar8 * lVar16 + uVar7] =
               (short)(auVar31._0_4_ + (iVar17 >> 1) >> (bVar9 & 0x1f));
          uVar7 = uVar7 + 1;
          puVar25 = puVar25 + lVar19;
        } while (uVar7 != uVar14);
      }
      uVar8 = uVar8 + 1;
      subpel_x_qn = subpel_x_qn + x_step_qn;
      puVar28 = puVar28 + lVar16;
    } while (uVar8 != (uint)w);
  }
  bVar9 = 0x16 - bVar9;
  uVar15 = 0xe - (iVar2 + conv_params->round_1);
  bVar10 = (byte)uVar15;
  uVar29 = 1 << (bVar9 & 0x1f);
  if (0 < h) {
    auVar30 = ZEXT416((uint)conv_params->round_1);
    pCVar4 = conv_params->dst;
    iVar20 = (1 << (bVar10 & 0x1f)) >> 1;
    auVar31._0_4_ = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
    auVar31._4_4_ = auVar31._0_4_;
    auVar31._8_4_ = auVar31._0_4_;
    auVar31._12_4_ = auVar31._0_4_;
    iVar2 = conv_params->dst_stride;
    bVar11 = (byte)conv_params->round_1;
    bVar12 = bVar9 - bVar11;
    iVar17 = ((1 << (bVar11 & 0x1f)) >> 1) + uVar29;
    uVar22 = iVar20 - ((1 << (bVar12 & 0x1f)) + (1 << (bVar12 - 1 & 0x1f)));
    auVar33 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
    uStack_10cb0 = 0;
    puVar25 = dst8;
    pCVar23 = pCVar4;
    do {
      uVar5 = (uint)subpel_y_qn >> 6 & 0xf;
      uVar1 = filter_params_y->taps;
      piVar3 = filter_params_y->filter_ptr;
      uVar8 = 0;
      if (3 < w) {
        pauVar27 = (undefined1 (*) [16])(auStack_10c38 + (subpel_y_qn >> 10));
        auVar35 = *(undefined1 (*) [16])(piVar3 + uVar5 * uVar1);
        uVar8 = 0;
        do {
          auVar36 = pmaddwd(*pauVar27,auVar35);
          auVar39 = pmaddwd(*(undefined1 (*) [16])(*pauVar27 + lVar16 * 2),auVar35);
          auVar36 = phaddd(auVar36,auVar39);
          auVar39 = pmaddwd(*(undefined1 (*) [16])(*pauVar27 + (long)(int)(uVar14 * 2) * 2),auVar35)
          ;
          auVar52 = pmaddwd(*(undefined1 (*) [16])(*pauVar27 + (long)(int)(uVar14 * 3) * 2),auVar35)
          ;
          in_XMM8 = phaddd(auVar39,auVar52);
          auVar36 = phaddd(auVar36,in_XMM8);
          auVar39._0_4_ = auVar36._0_4_ + iVar17 >> auVar30;
          auVar39._4_4_ = auVar36._4_4_ + iVar17 >> auVar30;
          auVar39._8_4_ = auVar36._8_4_ + iVar17 >> auVar30;
          auVar39._12_4_ = auVar36._12_4_ + iVar17 >> auVar30;
          in_XMM7 = packusdw(auVar39,auVar39);
          sVar38 = in_XMM7._0_2_;
          sVar32 = auVar33._0_2_;
          sVar34 = auVar33._2_2_;
          sVar40 = in_XMM7._2_2_;
          sVar41 = in_XMM7._4_2_;
          sVar42 = in_XMM7._6_2_;
          auVar36._8_2_ = in_XMM7._8_2_;
          auVar36._10_2_ = in_XMM7._10_2_;
          auVar36._12_2_ = in_XMM7._12_2_;
          auVar36._14_2_ = in_XMM7._14_2_;
          if (conv_params->is_compound == 0) {
            auVar52._0_2_ = sVar38 + sVar32;
            auVar52._2_2_ = sVar40 + sVar34;
            auVar52._4_2_ = sVar41 + sVar32;
            auVar52._6_2_ = sVar42 + sVar34;
            auVar52._8_2_ = auVar36._8_2_ + sVar32;
            auVar52._10_2_ = auVar36._10_2_ + sVar34;
            auVar52._12_2_ = auVar36._12_2_ + sVar32;
            auVar52._14_2_ = auVar36._14_2_ + sVar34;
            auVar36 = psraw(auVar52,ZEXT416(uVar15));
            sVar32 = auVar36._0_2_;
            sVar34 = auVar36._2_2_;
            sVar38 = auVar36._4_2_;
            sVar40 = auVar36._6_2_;
            in_XMM7._0_4_ =
                 CONCAT13((0 < sVar40) * (sVar40 < 0x100) * auVar36[6] - (0xff < sVar40),
                          CONCAT12((0 < sVar38) * (sVar38 < 0x100) * auVar36[4] - (0xff < sVar38),
                                   CONCAT11((0 < sVar34) * (sVar34 < 0x100) * auVar36[2] -
                                            (0xff < sVar34),
                                            (0 < sVar32) * (sVar32 < 0x100) * auVar36[0] -
                                            (0xff < sVar32))));
            sVar41 = auVar36._8_2_;
            in_XMM7[4] = (0 < sVar41) * (sVar41 < 0x100) * auVar36[8] - (0xff < sVar41);
            sVar42 = auVar36._10_2_;
            in_XMM7[5] = (0 < sVar42) * (sVar42 < 0x100) * auVar36[10] - (0xff < sVar42);
            sVar49 = auVar36._12_2_;
            in_XMM7[6] = (0 < sVar49) * (sVar49 < 0x100) * auVar36[0xc] - (0xff < sVar49);
            sVar50 = auVar36._14_2_;
            in_XMM7[7] = (0 < sVar50) * (sVar50 < 0x100) * auVar36[0xe] - (0xff < sVar50);
            in_XMM7[8] = (0 < sVar32) * (sVar32 < 0x100) * auVar36[0] - (0xff < sVar32);
            in_XMM7[9] = (0 < sVar34) * (sVar34 < 0x100) * auVar36[2] - (0xff < sVar34);
            in_XMM7[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar36[4] - (0xff < sVar38);
            in_XMM7[0xb] = (0 < sVar40) * (sVar40 < 0x100) * auVar36[6] - (0xff < sVar40);
            in_XMM7[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar36[8] - (0xff < sVar41);
            in_XMM7[0xd] = (0 < sVar42) * (sVar42 < 0x100) * auVar36[10] - (0xff < sVar42);
            in_XMM7[0xe] = (0 < sVar49) * (sVar49 < 0x100) * auVar36[0xc] - (0xff < sVar49);
            in_XMM7[0xf] = (0 < sVar50) * (sVar50 < 0x100) * auVar36[0xe] - (0xff < sVar50);
            *(undefined4 *)(puVar25 + uVar8) = in_XMM7._0_4_;
          }
          else if (conv_params->do_average == 0) {
            *(long *)(pCVar23 + uVar8) = in_XMM7._0_8_;
          }
          else {
            uVar7 = *(ulong *)(pCVar23 + uVar8);
            sVar51 = (short)(uVar7 >> 0x30);
            sVar50 = (short)(uVar7 >> 0x20);
            auVar43._0_2_ = (short)uVar7;
            sVar49 = (short)(uVar7 >> 0x10);
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              auVar36._0_2_ = sVar38 + auVar43._0_2_;
              auVar36._2_2_ = sVar40 + sVar49;
              auVar36._4_2_ = sVar41 + sVar50;
              auVar36._6_2_ = sVar42 + sVar51;
              in_XMM7 = psraw(auVar36,1);
              auVar36 = in_XMM7;
            }
            else {
              auVar46._8_4_ = 0;
              auVar46._0_8_ = uVar7;
              auVar46._12_2_ = sVar51;
              auVar46._14_2_ = sVar42;
              auVar45._12_4_ = auVar46._12_4_;
              auVar45._8_2_ = 0;
              auVar45._0_8_ = uVar7;
              auVar45._10_2_ = sVar41;
              auVar44._10_6_ = auVar45._10_6_;
              auVar44._8_2_ = sVar50;
              auVar44._0_8_ = uVar7;
              auVar43._8_8_ = auVar44._8_8_;
              auVar43._6_2_ = sVar40;
              auVar43._4_2_ = sVar49;
              auVar43._2_2_ = sVar38;
              auVar36 = pmaddwd(auVar43,auVar31);
              auVar47._0_4_ = auVar36._0_4_ >> 4;
              auVar47._4_4_ = auVar36._4_4_ >> 4;
              auVar47._8_4_ = auVar36._8_4_ >> 4;
              auVar47._12_4_ = auVar36._12_4_ >> 4;
              auVar36 = packusdw(auVar47,auVar47);
            }
            auVar48._0_2_ = auVar36._0_2_ + sVar32;
            auVar48._2_2_ = auVar36._2_2_ + sVar34;
            auVar48._4_2_ = auVar36._4_2_ + sVar32;
            auVar48._6_2_ = auVar36._6_2_ + sVar34;
            auVar48._8_2_ = auVar36._8_2_ + sVar32;
            auVar48._10_2_ = auVar36._10_2_ + sVar34;
            auVar48._12_2_ = auVar36._12_2_ + sVar32;
            auVar48._14_2_ = auVar36._14_2_ + sVar34;
            auVar36 = psraw(auVar48,ZEXT416(uVar15));
            sVar32 = auVar36._0_2_;
            sVar34 = auVar36._2_2_;
            sVar38 = auVar36._4_2_;
            sVar40 = auVar36._6_2_;
            in_XMM8._0_4_ =
                 CONCAT13((0 < sVar40) * (sVar40 < 0x100) * auVar36[6] - (0xff < sVar40),
                          CONCAT12((0 < sVar38) * (sVar38 < 0x100) * auVar36[4] - (0xff < sVar38),
                                   CONCAT11((0 < sVar34) * (sVar34 < 0x100) * auVar36[2] -
                                            (0xff < sVar34),
                                            (0 < sVar32) * (sVar32 < 0x100) * auVar36[0] -
                                            (0xff < sVar32))));
            sVar41 = auVar36._8_2_;
            in_XMM8[4] = (0 < sVar41) * (sVar41 < 0x100) * auVar36[8] - (0xff < sVar41);
            sVar42 = auVar36._10_2_;
            in_XMM8[5] = (0 < sVar42) * (sVar42 < 0x100) * auVar36[10] - (0xff < sVar42);
            sVar49 = auVar36._12_2_;
            in_XMM8[6] = (0 < sVar49) * (sVar49 < 0x100) * auVar36[0xc] - (0xff < sVar49);
            sVar50 = auVar36._14_2_;
            in_XMM8[7] = (0 < sVar50) * (sVar50 < 0x100) * auVar36[0xe] - (0xff < sVar50);
            in_XMM8[8] = (0 < sVar32) * (sVar32 < 0x100) * auVar36[0] - (0xff < sVar32);
            in_XMM8[9] = (0 < sVar34) * (sVar34 < 0x100) * auVar36[2] - (0xff < sVar34);
            in_XMM8[10] = (0 < sVar38) * (sVar38 < 0x100) * auVar36[4] - (0xff < sVar38);
            in_XMM8[0xb] = (0 < sVar40) * (sVar40 < 0x100) * auVar36[6] - (0xff < sVar40);
            in_XMM8[0xc] = (0 < sVar41) * (sVar41 < 0x100) * auVar36[8] - (0xff < sVar41);
            in_XMM8[0xd] = (0 < sVar42) * (sVar42 < 0x100) * auVar36[10] - (0xff < sVar42);
            in_XMM8[0xe] = (0 < sVar49) * (sVar49 < 0x100) * auVar36[0xc] - (0xff < sVar49);
            in_XMM8[0xf] = (0 < sVar50) * (sVar50 < 0x100) * auVar36[0xe] - (0xff < sVar50);
            *(undefined4 *)(puVar25 + uVar8) = in_XMM8._0_4_;
          }
          uVar8 = uVar8 + 4;
          pauVar27 = (undefined1 (*) [16])(*pauVar27 + lVar16 * 8);
        } while ((long)uVar8 <= (long)(w + -4));
      }
      if ((int)uVar8 < w) {
        lVar19 = uStack_10cb0 * (long)iVar2;
        lVar24 = uStack_10cb0 * (long)dst8_stride;
        uVar8 = uVar8 & 0xffffffff;
        lVar6 = (long)auStack_10c38 + lVar16 * 2 * uVar8 + (long)(subpel_y_qn >> 10) * 2;
        do {
          lVar13 = 0;
          auVar35 = ZEXT416(uVar29);
          do {
            in_XMM7 = pmovzxwd(in_XMM7,*(undefined8 *)
                                        ((long)piVar3 +
                                        lVar13 * 2 + (ulong)((uint)uVar1 * 2) * (ulong)uVar5));
            auVar36 = pmovzxwd(in_XMM8,*(undefined8 *)(lVar6 + lVar13 * 2));
            in_XMM8 = pmaddwd(auVar36,in_XMM7);
            auVar37._0_4_ = auVar35._0_4_ + in_XMM8._0_4_;
            auVar37._4_4_ = auVar35._4_4_ + in_XMM8._4_4_;
            auVar37._8_4_ = auVar35._8_4_ + in_XMM8._8_4_;
            auVar37._12_4_ = auVar35._12_4_ + in_XMM8._12_4_;
            lVar13 = lVar13 + 4;
            auVar35 = auVar37;
          } while (lVar13 != 8);
          auVar35 = phaddd(auVar37,auVar37);
          auVar35 = phaddd(auVar35,auVar35);
          bVar12 = (byte)conv_params->round_1;
          uVar26 = ((1 << (bVar12 & 0x1f)) >> 1) + auVar35._0_4_ >> (bVar12 & 0x1f);
          if (conv_params->is_compound == 0) {
            iVar21 = (int)((-1 << (bVar9 - bVar12 & 0x1f)) + iVar20 +
                           (-1 << ((bVar9 - bVar12) - 1 & 0x1f)) + (uVar26 & 0xffff)) >>
                     (bVar10 & 0x1f);
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            uVar18 = (uint8_t)iVar21;
            if (0xfe < iVar21) {
              uVar18 = 0xff;
            }
            dst8[uVar8 + lVar24] = uVar18;
          }
          else if (conv_params->do_average == 0) {
            pCVar4[lVar19 + uVar8] = (CONV_BUF_TYPE)uVar26;
          }
          else {
            if (conv_params->use_dist_wtd_comp_avg == 0) {
              uVar26 = (uVar26 & 0xffff) + (uint)pCVar4[lVar19 + uVar8] >> 1;
            }
            else {
              uVar26 = (int)((uVar26 & 0xffff) * conv_params->bck_offset +
                            (uint)pCVar4[lVar19 + uVar8] * conv_params->fwd_offset) >> 4;
            }
            iVar21 = (int)(uVar26 + uVar22) >> (bVar10 & 0x1f);
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            uVar18 = (uint8_t)iVar21;
            if (0xfe < iVar21) {
              uVar18 = 0xff;
            }
            dst8[uVar8 + lVar24] = uVar18;
          }
          uVar8 = uVar8 + 1;
          lVar6 = lVar6 + lVar16 * 2;
        } while (uVar8 != (uint)w);
      }
      uStack_10cb0 = uStack_10cb0 + 1;
      subpel_y_qn = subpel_y_qn + y_step_qn;
      pCVar23 = pCVar23 + iVar2;
      puVar25 = puVar25 + dst8_stride;
    } while (uStack_10cb0 != (uint)h);
  }
  return;
}

Assistant:

void av1_convolve_2d_scale_sse4_1(const uint8_t *src, int src_stride,
                                  uint8_t *dst8, int dst8_stride, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_x_qn, const int x_step_qn,
                                  const int subpel_y_qn, const int y_step_qn,
                                  ConvolveParams *conv_params) {
  int16_t tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;

  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h, subpel_x_qn,
           x_step_qn, filter_params_x, conv_params->round_0);

  // vertical filter (input is transposed)
  vfilter8(tmp, im_h, dst8, dst8_stride, w, h, subpel_y_qn, y_step_qn,
           filter_params_y, conv_params, 8);
}